

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

cubeb_device_state pulse_get_state_from_source_port(pa_source_port_info *info)

{
  pa_source_port_info *info_local;
  cubeb_device_state local_4;
  
  if (info == (pa_source_port_info *)0x0) {
    local_4 = CUBEB_DEVICE_STATE_ENABLED;
  }
  else if ((has_pulse_v2 == 0) || (info->available != 1)) {
    local_4 = CUBEB_DEVICE_STATE_ENABLED;
  }
  else {
    local_4 = CUBEB_DEVICE_STATE_UNPLUGGED;
  }
  return local_4;
}

Assistant:

static cubeb_device_state
pulse_get_state_from_source_port(pa_source_port_info * info)
{
  if (info != NULL) {
#if PA_CHECK_VERSION(2, 0, 0)
    if (has_pulse_v2 && info->available == PA_PORT_AVAILABLE_NO)
      return CUBEB_DEVICE_STATE_UNPLUGGED;
    else /*if (info->available == PA_PORT_AVAILABLE_YES) + UNKNOWN */
#endif
      return CUBEB_DEVICE_STATE_ENABLED;
  }

  return CUBEB_DEVICE_STATE_ENABLED;
}